

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ExportDirWrapper::getName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  qsizetype qVar1;
  QString local_60;
  undefined1 local_38 [8];
  QString libName;
  ExportDirWrapper *this_local;
  QString *infoName;
  
  libName.d.size._7_1_ = 0;
  QString::QString(__return_storage_ptr__,"Export");
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(local_38);
  qVar1 = QString::length((QString *)local_38);
  if (-1 < qVar1) {
    operator+(&local_60,": ",(QString *)local_38);
    QString::operator+=(__return_storage_ptr__,&local_60);
    QString::~QString(&local_60);
  }
  libName.d.size._7_1_ = 1;
  QString::~QString((QString *)local_38);
  if ((libName.d.size._7_1_ & 1) == 0) {
    QString::~QString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getName()
{
    QString infoName = "Export";
    QString libName = this->getLibraryName();
    if (libName.length() >= 0) {
        infoName += ": "+ libName;
    }
    return infoName;
}